

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::FeedbackResourceListTestCase::iterate
          (FeedbackResourceListTestCase *this)

{
  ostringstream *this_00;
  RenderContext *renderCtx;
  Program *programDefinition;
  TestLog *log;
  bool bVar1;
  int iVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  undefined4 extraout_var;
  ProgramInterface interface;
  string *description;
  int ndx;
  long lVar4;
  long lVar5;
  allocator<char> local_2d1;
  ScopedLogSection section;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedResources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  MessageBuilder builder;
  ShaderProgram program;
  
  renderCtx = ((this->super_ResourceListTestCase).super_TestCase.m_context)->m_renderCtx;
  generateProgramInterfaceProgramSources
            ((ProgramSources *)&builder,(this->super_ResourceListTestCase).m_programDefinition);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)&builder);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&builder);
  tcu::TestContext::setTestResult
            ((this->super_ResourceListTestCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  builder.m_log =
       ((this->super_ResourceListTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  this_00 = &builder.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Transform feedback varyings: {");
  lVar5 = 0;
  lVar4 = 0;
  while( true ) {
    pvVar3 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                       ((this->super_ResourceListTestCase).m_programDefinition);
    if ((int)((ulong)((long)(pvVar3->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pvVar3->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 5) <= lVar4) break;
    if (lVar5 != 0) {
      std::operator<<((ostream *)this_00,", ");
    }
    std::operator<<((ostream *)this_00,"\"");
    pvVar3 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                       ((this->super_ResourceListTestCase).m_programDefinition);
    std::operator<<((ostream *)this_00,
                    (string *)
                    ((long)&(((pvVar3->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5
                    ));
    std::operator<<((ostream *)this_00,"\"");
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0x20;
  }
  std::operator<<((ostream *)this_00,"}");
  tcu::MessageBuilder::operator<<(&builder,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  programDefinition = (this->super_ResourceListTestCase).m_programDefinition;
  iVar2 = (*((this->super_ResourceListTestCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  checkAndLogProgram(&program,programDefinition,(Functions *)CONCAT44(extraout_var,iVar2),
                     ((this->super_ResourceListTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log);
  log = ((this->super_ResourceListTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
        ->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&builder,"ResourceList",(allocator<char> *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedResources,"Resource list",&local_2d1);
  description = (string *)&expectedResources;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&builder,description);
  interface = (ProgramInterface)description;
  std::__cxx11::string::~string((string *)&expectedResources);
  std::__cxx11::string::~string((string *)&builder);
  builder.m_log = (TestLog *)0x0;
  builder.m_str = (ostringstream)0x0;
  builder._9_7_ = 0;
  builder._16_8_ = 0;
  expectedResources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  expectedResources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  expectedResources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ResourceListTestCase::queryResourceList
            (&this->super_ResourceListTestCase,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&builder,program.m_program.m_program);
  getProgramInterfaceResourceList_abi_cxx11_
            (&local_2a0,(Functional *)(this->super_ResourceListTestCase).m_programDefinition,
             (Program *)(ulong)(this->super_ResourceListTestCase).m_programInterface,interface);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&expectedResources,&local_2a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a0);
  bVar1 = ResourceListTestCase::verifyResourceList
                    (&this->super_ResourceListTestCase,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&builder,&expectedResources);
  if (!bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_ResourceListTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"invalid resource list");
  }
  bVar1 = ResourceListTestCase::verifyResourceIndexQuery
                    (&this->super_ResourceListTestCase,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&builder,&expectedResources,program.m_program.m_program);
  if (!bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_ResourceListTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"GetProgramResourceIndex returned unexpected values");
  }
  bVar1 = ResourceListTestCase::verifyMaxNameLength
                    (&this->super_ResourceListTestCase,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&builder,program.m_program.m_program);
  if (!bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_ResourceListTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"MAX_NAME_LENGTH invalid");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&expectedResources);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&builder);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  glu::ShaderProgram::~ShaderProgram(&program);
  return STOP;
}

Assistant:

FeedbackResourceListTestCase::IterateResult FeedbackResourceListTestCase::iterate (void)
{
	const glu::ShaderProgram program(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_programDefinition));

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Feedback varyings
	{
		tcu::MessageBuilder builder(&m_testCtx.getLog());
		builder << "Transform feedback varyings: {";
		for (int ndx = 0; ndx < (int)m_programDefinition->getTransformFeedbackVaryings().size(); ++ndx)
		{
			if (ndx)
				builder << ", ";
			builder << "\"" << m_programDefinition->getTransformFeedbackVaryings()[ndx] << "\"";
		}
		builder << "}" << tcu::TestLog::EndMessage;
	}

	checkAndLogProgram(program, m_programDefinition, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// Check resource list
	{
		const tcu::ScopedLogSection	section				(m_testCtx.getLog(), "ResourceList", "Resource list");
		std::vector<std::string>	resourceList;
		std::vector<std::string>	expectedResources;

		queryResourceList(resourceList, program.getProgram());
		expectedResources = getProgramInterfaceResourceList(m_programDefinition, m_programInterface);

		// verify the list and the expected list match

		if (!verifyResourceList(resourceList, expectedResources))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "invalid resource list");

		// verify GetProgramResourceIndex() matches the indices of the list

		if (!verifyResourceIndexQuery(resourceList, expectedResources, program.getProgram()))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "GetProgramResourceIndex returned unexpected values");

		// Verify MAX_NAME_LENGTH
		if (!verifyMaxNameLength(resourceList, program.getProgram()))
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "MAX_NAME_LENGTH invalid");
	}

	return STOP;
}